

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O2

int32_t adt_hash_keys(adt_hash_t *self,adt_ary_t *pArray)

{
  char *pElem;
  int32_t iVar1;
  int s32Index;
  char *pKey;
  char *local_30;
  
  iVar1 = 0;
  if (pArray != (adt_ary_t *)0x0 && self != (adt_hash_t *)0x0) {
    adt_hash_iter_init(self);
    adt_ary_clear(pArray);
    adt_ary_extend(pArray,self->u32Size);
    s32Index = 0;
    do {
      adt_hash_iter_next(self,&local_30);
      if (local_30 == (char *)0x0) {
        return s32Index;
      }
      iVar1 = s32Index + 1;
      pElem = strdup(local_30);
      adt_ary_set(pArray,s32Index,pElem);
      s32Index = iVar1;
    } while (local_30 != (char *)0x0);
  }
  return iVar1;
}

Assistant:

int32_t adt_hash_keys(adt_hash_t *self,adt_ary_t *pArray){
	const char *pKey;
	int32_t s32i=0;

	if( (self==0) || (pArray==0)) return 0;

   adt_hash_iter_init(self);
   adt_ary_clear(pArray);
   adt_ary_extend(pArray, adt_hash_length(self));
   do{
      (void) adt_hash_iter_next(self,&pKey);
      if(pKey != 0){
         adt_ary_set(pArray,s32i++, STRDUP(pKey));
      }
   }while(pKey);

	return (uint32_t) s32i;
}